

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O1

void __thiscall HEkkDual::majorUpdateFtranFinal(HEkkDual *this)

{
  uint32_t *puVar1;
  __atomic_base<int> _Var2;
  double dVar3;
  int iVar4;
  uint uVar5;
  uint32_t uVar6;
  HVectorBase<double> *this_00;
  HVectorBase<double> *this_01;
  HVector_ptr pHVar7;
  HVector_ptr pHVar8;
  element_type *peVar9;
  pointer pdVar10;
  pointer pdVar11;
  HighsTask *pHVar12;
  HighsSplitDeque *pHVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  MFinish *pMVar20;
  MFinish *pMVar21;
  double pivot;
  double *myRow;
  double *pivotArray;
  double *myCol;
  double local_c8;
  long local_c0;
  pointer local_b8;
  TaskGroup local_b0;
  anon_class_24_3_5893e9c0 local_a0;
  pointer local_88;
  pointer local_80;
  double local_78;
  undefined8 uStack_70;
  MFinish *local_60;
  long *local_58;
  long local_50;
  MFinish *local_48;
  undefined8 uStack_40;
  
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x46,0);
  if ((this->dualRHS).workCount < 0) {
    if (0 < this->multi_nFinish) {
      pMVar20 = this->multi_finish;
      local_58 = (long *)__tls_get_addr();
      lVar16 = 0;
      local_60 = pMVar20;
      do {
        pHVar7 = pMVar20[lVar16].col_aq;
        pHVar7->count = -1;
        pHVar8 = pMVar20[lVar16].row_ep;
        pHVar8->count = -1;
        local_80 = (pHVar7->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
        local_b8 = (pHVar8->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
        if (lVar16 != 0) {
          lVar17 = 0;
          local_50 = lVar16;
          do {
            local_c0 = (long)pMVar20[lVar17].row_out;
            local_78 = pMVar20[lVar17].alpha_row;
            local_88 = ((pMVar20[lVar17].col_aq)->array).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
            pMVar21 = (MFinish *)local_b8[local_c0];
            if (1e-14 < ABS(local_80[local_c0])) {
              uStack_40 = 0;
              local_c8 = local_80[local_c0] / local_78;
              uVar18 = (ulong)this->solver_num_row;
              local_a0.myCol = &local_80;
              local_a0.pivotArray = &local_88;
              local_48 = pMVar21;
              if ((long)uVar18 < 0x65) {
                local_a0.pivot = &local_c8;
                if (0 < this->solver_num_row) {
                  uVar14 = 0;
                  do {
                    local_80[uVar14] = local_80[uVar14] - local_c8 * local_88[uVar14];
                    uVar14 = uVar14 + 1;
                    local_a0.pivot = &local_c8;
                  } while (uVar18 != uVar14);
                }
              }
              else {
                local_a0.pivot = &local_c8;
                HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
                local_b0.workerDeque = (HighsSplitDeque *)*local_58;
                local_b0.dequeHead = ((local_b0.workerDeque)->ownerData).head;
                do {
                  pHVar13 = local_b0.workerDeque;
                  uVar19 = uVar18 >> 1 & 0x7fffffff;
                  uVar5 = ((local_b0.workerDeque)->ownerData).head;
                  uVar14 = (ulong)uVar5;
                  uVar15 = (uint)uVar18;
                  if (uVar14 < 0x2000) {
                    ((local_b0.workerDeque)->ownerData).head = uVar5 + 1;
                    ((local_b0.workerDeque)->taskArray)._M_elems[uVar14].metadata.stealer.
                    super___atomic_base<unsigned_long>._M_i = 0;
                    *(undefined ***)((local_b0.workerDeque)->taskArray)._M_elems[uVar14].taskData =
                         &PTR_operator___004494f0;
                    *(HighsInt *)(((local_b0.workerDeque)->taskArray)._M_elems[uVar14].taskData + 8)
                         = (HighsInt)uVar19;
                    *(uint *)(((local_b0.workerDeque)->taskArray)._M_elems[uVar14].taskData + 0xc) =
                         uVar15;
                    pHVar12 = ((local_b0.workerDeque)->taskArray)._M_elems + uVar14;
                    pHVar12->taskData[0x10] = 'd';
                    pHVar12->taskData[0x11] = '\0';
                    pHVar12->taskData[0x12] = '\0';
                    pHVar12->taskData[0x13] = '\0';
                    *(anon_class_24_3_5893e9c0 **)
                     (((local_b0.workerDeque)->taskArray)._M_elems[uVar14].taskData + 0x18) =
                         &local_a0;
                    if (((local_b0.workerDeque)->ownerData).allStolenCopy == true) {
                      uVar6 = ((local_b0.workerDeque)->ownerData).head;
                      ((local_b0.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>.
                      _M_i = CONCAT44(uVar6 - 1,uVar6);
                      ((local_b0.workerDeque)->stealerData).allStolen._M_base._M_i = false;
                      ((local_b0.workerDeque)->ownerData).splitCopy =
                           ((local_b0.workerDeque)->ownerData).head;
                      ((local_b0.workerDeque)->ownerData).allStolenCopy = false;
                      if ((((local_b0.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
                        ((local_b0.workerDeque)->splitRequest)._M_base._M_i = false;
                      }
                      peVar9 = ((local_b0.workerDeque)->ownerData).workerBunk.
                               super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr;
                      LOCK();
                      _Var2._M_i = (peVar9->haveJobs).super___atomic_base<int>._M_i;
                      (peVar9->haveJobs).super___atomic_base<int>._M_i =
                           (peVar9->haveJobs).super___atomic_base<int>._M_i + 1;
                      UNLOCK();
                      if (_Var2._M_i < ((local_b0.workerDeque)->ownerData).numWorkers + -1) {
                        HighsSplitDeque::WorkerBunk::publishWork
                                  (((local_b0.workerDeque)->ownerData).workerBunk.
                                   super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,local_b0.workerDeque);
                      }
                    }
                    else {
                      HighsSplitDeque::growShared(local_b0.workerDeque);
                    }
                  }
                  else {
                    if ((((local_b0.workerDeque)->ownerData).splitCopy < 0x2000) &&
                       (((local_b0.workerDeque)->ownerData).allStolenCopy == false)) {
                      HighsSplitDeque::growShared(local_b0.workerDeque);
                    }
                    puVar1 = &(pHVar13->ownerData).head;
                    *puVar1 = *puVar1 + 1;
                    ::highs::parallel::for_each<HEkkDual::majorUpdateFtranFinal()::__0&>
                              ((HighsInt)uVar19,uVar15,&local_a0,100);
                  }
                  uVar18 = uVar19;
                } while (0xc9 < uVar15);
                if (1 < uVar15) {
                  pdVar10 = *local_a0.pivotArray;
                  pdVar11 = *local_a0.myCol;
                  uVar18 = 0;
                  do {
                    pdVar11[uVar18] = pdVar11[uVar18] - *local_a0.pivot * pdVar10[uVar18];
                    uVar18 = uVar18 + 1;
                  } while (uVar19 != uVar18);
                }
                ::highs::parallel::TaskGroup::taskWait(&local_b0);
                lVar16 = local_50;
                pMVar20 = local_60;
                ::highs::parallel::TaskGroup::~TaskGroup(&local_b0);
              }
              local_80[local_c0] = local_c8;
              pMVar21 = local_48;
            }
            if (1e-14 < ABS((double)pMVar21)) {
              local_c8 = (double)pMVar21 / local_78;
              uVar18 = (ulong)this->solver_num_row;
              local_a0.myCol = &local_b8;
              local_a0.pivotArray = &local_88;
              if ((long)uVar18 < 0x65) {
                local_a0.pivot = &local_c8;
                if (0 < this->solver_num_row) {
                  uVar14 = 0;
                  do {
                    local_b8[uVar14] = local_b8[uVar14] - local_c8 * local_88[uVar14];
                    uVar14 = uVar14 + 1;
                    local_a0.pivot = &local_c8;
                  } while (uVar18 != uVar14);
                }
              }
              else {
                local_a0.pivot = &local_c8;
                HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
                local_b0.workerDeque = (HighsSplitDeque *)*local_58;
                local_b0.dequeHead = ((local_b0.workerDeque)->ownerData).head;
                do {
                  pHVar13 = local_b0.workerDeque;
                  uVar19 = uVar18 >> 1 & 0x7fffffff;
                  uVar5 = ((local_b0.workerDeque)->ownerData).head;
                  uVar14 = (ulong)uVar5;
                  uVar15 = (uint)uVar18;
                  if (uVar14 < 0x2000) {
                    ((local_b0.workerDeque)->ownerData).head = uVar5 + 1;
                    ((local_b0.workerDeque)->taskArray)._M_elems[uVar14].metadata.stealer.
                    super___atomic_base<unsigned_long>._M_i = 0;
                    *(undefined ***)((local_b0.workerDeque)->taskArray)._M_elems[uVar14].taskData =
                         &PTR_operator___00449550;
                    *(HighsInt *)(((local_b0.workerDeque)->taskArray)._M_elems[uVar14].taskData + 8)
                         = (HighsInt)uVar19;
                    *(uint *)(((local_b0.workerDeque)->taskArray)._M_elems[uVar14].taskData + 0xc) =
                         uVar15;
                    pHVar12 = ((local_b0.workerDeque)->taskArray)._M_elems + uVar14;
                    pHVar12->taskData[0x10] = 'd';
                    pHVar12->taskData[0x11] = '\0';
                    pHVar12->taskData[0x12] = '\0';
                    pHVar12->taskData[0x13] = '\0';
                    *(anon_class_24_3_5893e9c0 **)
                     (((local_b0.workerDeque)->taskArray)._M_elems[uVar14].taskData + 0x18) =
                         &local_a0;
                    if (((local_b0.workerDeque)->ownerData).allStolenCopy == true) {
                      uVar6 = ((local_b0.workerDeque)->ownerData).head;
                      ((local_b0.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>.
                      _M_i = CONCAT44(uVar6 - 1,uVar6);
                      ((local_b0.workerDeque)->stealerData).allStolen._M_base._M_i = false;
                      ((local_b0.workerDeque)->ownerData).splitCopy =
                           ((local_b0.workerDeque)->ownerData).head;
                      ((local_b0.workerDeque)->ownerData).allStolenCopy = false;
                      if ((((local_b0.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
                        ((local_b0.workerDeque)->splitRequest)._M_base._M_i = false;
                      }
                      peVar9 = ((local_b0.workerDeque)->ownerData).workerBunk.
                               super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr;
                      LOCK();
                      _Var2._M_i = (peVar9->haveJobs).super___atomic_base<int>._M_i;
                      (peVar9->haveJobs).super___atomic_base<int>._M_i =
                           (peVar9->haveJobs).super___atomic_base<int>._M_i + 1;
                      UNLOCK();
                      if (_Var2._M_i < ((local_b0.workerDeque)->ownerData).numWorkers + -1) {
                        HighsSplitDeque::WorkerBunk::publishWork
                                  (((local_b0.workerDeque)->ownerData).workerBunk.
                                   super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,local_b0.workerDeque);
                      }
                    }
                    else {
                      HighsSplitDeque::growShared(local_b0.workerDeque);
                    }
                  }
                  else {
                    if ((((local_b0.workerDeque)->ownerData).splitCopy < 0x2000) &&
                       (((local_b0.workerDeque)->ownerData).allStolenCopy == false)) {
                      HighsSplitDeque::growShared(local_b0.workerDeque);
                    }
                    puVar1 = &(pHVar13->ownerData).head;
                    *puVar1 = *puVar1 + 1;
                    ::highs::parallel::for_each<HEkkDual::majorUpdateFtranFinal()::__1&>
                              ((HighsInt)uVar19,uVar15,(anon_class_24_3_5967739a *)&local_a0,100);
                  }
                  uVar18 = uVar19;
                } while (0xc9 < uVar15);
                if (1 < uVar15) {
                  pdVar10 = *local_a0.pivotArray;
                  pdVar11 = *local_a0.myCol;
                  uVar18 = 0;
                  do {
                    pdVar11[uVar18] = pdVar11[uVar18] - *local_a0.pivot * pdVar10[uVar18];
                    uVar18 = uVar18 + 1;
                  } while (uVar19 != uVar18);
                }
                ::highs::parallel::TaskGroup::taskWait(&local_b0);
                lVar16 = local_50;
                pMVar20 = local_60;
                ::highs::parallel::TaskGroup::~TaskGroup(&local_b0);
              }
              local_b8[local_c0] = local_c8;
            }
            lVar17 = lVar17 + 1;
          } while (lVar17 != lVar16);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < this->multi_nFinish);
    }
  }
  else if (0 < this->multi_nFinish) {
    local_48 = this->multi_finish;
    lVar17 = 0;
    lVar16 = 0;
    do {
      local_c0 = lVar16;
      if (lVar16 != 0) {
        this_00 = local_48[lVar16].row_ep;
        this_01 = local_48[lVar16].col_aq;
        lVar16 = 0;
        do {
          iVar4 = *(int *)((long)&this->multi_finish[0].row_out + lVar16);
          dVar3 = (this_01->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar4];
          if (1e-14 < ABS(dVar3)) {
            local_78 = dVar3 / *(double *)((long)&this->multi_finish[0].alpha_row + lVar16);
            uStack_70 = 0;
            HVectorBase<double>::saxpy<double,double>
                      (this_01,-local_78,
                       *(HVectorBase<double> **)((long)&this->multi_finish[0].col_aq + lVar16));
            (this_01->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar4] = local_78;
          }
          dVar3 = (this_00->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar4];
          if (1e-14 < ABS(dVar3)) {
            local_78 = dVar3 / *(double *)((long)&this->multi_finish[0].alpha_row + lVar16);
            uStack_70 = 0;
            HVectorBase<double>::saxpy<double,double>
                      (this_00,-local_78,
                       *(HVectorBase<double> **)((long)&this->multi_finish[0].col_aq + lVar16));
            (this_00->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar4] = local_78;
          }
          lVar16 = lVar16 + 0x78;
        } while (lVar17 != lVar16);
      }
      lVar16 = local_c0 + 1;
      lVar17 = lVar17 + 0x78;
    } while (lVar16 < this->multi_nFinish);
  }
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x46,0);
  return;
}

Assistant:

void HEkkDual::majorUpdateFtranFinal() {
  analysis->simplexTimerStart(FtranMixFinalClock);
  HighsInt updateFTRAN_inDense = dualRHS.workCount < 0;
  if (updateFTRAN_inDense) {
    for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
      multi_finish[iFn].col_aq->count = -1;
      multi_finish[iFn].row_ep->count = -1;
      double* myCol = multi_finish[iFn].col_aq->array.data();
      double* myRow = multi_finish[iFn].row_ep->array.data();
      for (HighsInt jFn = 0; jFn < iFn; jFn++) {
        HighsInt pivotRow = multi_finish[jFn].row_out;
        const double pivotAlpha = multi_finish[jFn].alpha_row;
        const double* pivotArray = multi_finish[jFn].col_aq->array.data();
        double pivotX1 = myCol[pivotRow];
        double pivotX2 = myRow[pivotRow];

        // The FTRAN regular buffer
        if (fabs(pivotX1) > kHighsTiny) {
          const double pivot = pivotX1 / pivotAlpha;
          // #pragma omp parallel for
          highs::parallel::for_each(
              0, solver_num_row,
              [&](HighsInt start, HighsInt end) {
                for (HighsInt i = start; i < end; i++)
                  myCol[i] -= pivot * pivotArray[i];
              },
              100);
          myCol[pivotRow] = pivot;
        }
        // The FTRAN-DSE buffer
        if (fabs(pivotX2) > kHighsTiny) {
          const double pivot = pivotX2 / pivotAlpha;
          // #pragma omp parallel for
          highs::parallel::for_each(
              0, solver_num_row,
              [&](HighsInt start, HighsInt end) {
                for (HighsInt i = start; i < end; i++)
                  myRow[i] -= pivot * pivotArray[i];
              },
              100);
          myRow[pivotRow] = pivot;
        }
      }
    }
  } else {
    for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
      MFinish* finish = &multi_finish[iFn];
      HVector* Col = finish->col_aq;
      HVector* Row = finish->row_ep;
      for (HighsInt jFn = 0; jFn < iFn; jFn++) {
        MFinish* jFinish = &multi_finish[jFn];
        HighsInt pivotRow = jFinish->row_out;
        double pivotX1 = Col->array[pivotRow];
        // The FTRAN regular buffer
        if (fabs(pivotX1) > kHighsTiny) {
          pivotX1 /= jFinish->alpha_row;
          Col->saxpy(-pivotX1, jFinish->col_aq);
          Col->array[pivotRow] = pivotX1;
        }
        // The FTRAN-DSE buffer
        double pivotX2 = Row->array[pivotRow];
        if (fabs(pivotX2) > kHighsTiny) {
          pivotX2 /= jFinish->alpha_row;
          Row->saxpy(-pivotX2, jFinish->col_aq);
          Row->array[pivotRow] = pivotX2;
        }
      }
    }
  }
  analysis->simplexTimerStop(FtranMixFinalClock);
}